

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_wrapper_check(void *p)

{
  int iVar1;
  int local_14;
  int n;
  void *p_local;
  
  if ((p != (void *)0x0) && (iVar1 = stb__hashfind(p), iVar1 < 0)) {
    for (local_14 = 0; local_14 < stb__alloc_size; local_14 = local_14 + 1) {
      if (stb__allocations[local_14].p == p) {
        stb_fatal("Internal error: pointer %p was allocated, but hash search failed",p);
      }
    }
    iVar1 = stb__historyfind(p);
    if (-1 < iVar1) {
      stb_fatal("Checked %d-byte block %p previously freed/realloced at %s:%d",
                (ulong)(uint)stb__alloc_history[iVar1].size,p,stb__alloc_history[iVar1].file,
                (ulong)(uint)stb__alloc_history[iVar1].line);
    }
    stb_fatal("Checked unknown block %p");
  }
  return;
}

Assistant:

void stb_wrapper_check(void *p)
{
   int n;
   
   if (p == NULL) return;

   n = stb__hashfind(p);

   if (n >= 0) return;

   for (n=0; n < stb__alloc_size; ++n)
      if (stb__allocations[n].p == p)
         stb_fatal("Internal error: pointer %p was allocated, but hash search failed", p);

   // tried to free something that wasn't allocated!
   n = stb__historyfind(p);
   if (n >= 0)
      stb_fatal("Checked %d-byte block %p previously freed/realloced at %s:%d",
                    stb__alloc_history[n].size, p,
                    stb__alloc_history[n].file, stb__alloc_history[n].line);
   stb_fatal("Checked unknown block %p");
}